

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_set_tile_dim(fitsfile *fptr,int ndim,long *dims,int *status)

{
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int ii;
  undefined4 local_2c;
  undefined4 local_4;
  
  if ((in_ESI < 0) || (6 < in_ESI)) {
    *in_RCX = 0x140;
    ffpmsg((char *)0x1eb69c);
    local_4 = *in_RCX;
  }
  else {
    for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 8) + 0x3f0 + (long)local_2c * 8) =
           *(undefined8 *)(in_RDX + (long)local_2c * 8);
    }
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int fits_set_tile_dim(fitsfile *fptr,  /* I - FITS file pointer             */
           int ndim,   /* number of dimensions in the compressed image      */
           long *dims, /* size of image compression tile in each dimension  */
                      /* default tile size = (NAXIS1, 1, 1, ...)            */
           int *status)         /* IO - error status                        */
{
/*
   This routine specifies the size (dimension) of the image
   compression  tiles that should be used when writing a FITS
   image.  The image is divided into tiles, and each tile is compressed
   and stored in a row of at variable length binary table column.
*/
    int ii;

    if (ndim < 0 || ndim > MAX_COMPRESS_DIM)
    {
        *status = BAD_DIMEN;
	ffpmsg("illegal number of tile dimensions (fits_set_tile_dim)");
        return(*status);
    }

    for (ii = 0; ii < ndim; ii++)
    {
        (fptr->Fptr)->request_tilesize[ii] = dims[ii];
    }

    return(*status);
}